

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O3

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  double dVar1;
  uint uVar2;
  RhsScalar *pRVar3;
  ulong cols;
  LhsScalar *pLVar4;
  ulong uVar5;
  undefined8 *puVar6;
  int iVar7;
  ulong uVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  size_t __size;
  long lVar15;
  double *pdVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  double dVar22;
  double local_1a8;
  ulong local_1a0;
  long local_198;
  double *local_190;
  long local_188;
  double *local_180;
  double *local_178;
  long local_170;
  long local_168;
  long local_160;
  long startTarget;
  long local_150;
  long local_148;
  double *local_140;
  RhsScalar *local_138;
  double *local_130;
  double *local_128;
  ulong local_120;
  double *local_118;
  double *local_110;
  int local_104;
  long lStack_100;
  int l1;
  double *local_f8;
  double *local_f0;
  ulong local_e8;
  double *local_e0;
  RhsScalar local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  RhsScalar *local_a8;
  RhsScalar *local_a0;
  LhsScalar *local_98;
  RhsScalar *local_90;
  RhsScalar *local_88;
  uint local_80;
  uint local_7c;
  int l2;
  int l3;
  ulong local_70;
  double *local_68;
  double *local_60;
  ulong local_58;
  LhsScalar *local_50;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> local_41;
  ulong uStack_40;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_32;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_31 [7];
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  
  pdVar9 = &local_1a8;
  local_58 = triStride;
  local_f8 = _tri;
  local_d0 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    local_d0 = size;
  }
  local_70 = blocking->m_kc;
  local_c0 = local_d0 * blocking->m_kc;
  if (local_c0 >> 0x3d != 0) {
LAB_0010c620:
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = operator_delete;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_50 = blocking->m_blockA;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (local_c0 < 0x4001) {
      pdVar9 = (double *)((long)&local_1a8 - (local_c0 * 8 + 0xf & 0xfffffffffffffff0));
      local_98 = pdVar9;
      local_50 = pdVar9;
    }
    else {
      local_50 = (LhsScalar *)malloc(local_c0 * 8);
      local_98 = local_50;
      if (local_50 == (LhsScalar *)0x0) goto LAB_0010c620;
    }
  }
  else {
    local_98 = (LhsScalar *)0x0;
    pdVar9 = &local_1a8;
  }
  uVar8 = local_70 * otherSize;
  local_b8 = uVar8;
  if (0x1fffffffffffffff < uVar8) {
    pdVar9[-1] = 5.43152055886866e-318;
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = operator_delete;
    pdVar9[-1] = 5.43169842250116e-318;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a0 = blocking->m_blockB;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar8 < 0x4001) {
      pdVar9 = (double *)((long)pdVar9 - (uVar8 * 8 + 0xf & 0xfffffffffffffff0));
      local_90 = pdVar9;
      local_a0 = pdVar9;
    }
    else {
      pdVar9[-1] = 5.42185169417955e-318;
      local_a0 = (RhsScalar *)malloc(uVar8 * 8);
      local_90 = local_a0;
      if (local_a0 == (RhsScalar *)0x0) {
        pdVar9[-1] = 5.43199980254513e-318;
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = operator_delete;
        pdVar9[-1] = 5.43217766617763e-318;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_90 = (RhsScalar *)0x0;
  }
  uVar8 = local_58;
  if ((local_70 & 0x1c00000000000000) != 0) {
    pdVar9[-1] = 5.43174782906575e-318;
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = operator_delete;
    pdVar9[-1] = 5.43192569269825e-318;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  __size = local_70 * 0x40;
  local_a8 = blocking->m_blockW;
  if (blocking->m_blockW == (RhsScalar *)0x0) {
    if (__size < 0x20001) {
      pdVar9 = pdVar9 + local_70 * -8;
      bVar21 = false;
      local_88 = pdVar9;
      local_a8 = pdVar9;
    }
    else {
      pdVar9[-1] = 5.42258291133539e-318;
      local_88 = (RhsScalar *)malloc(__size);
      if (local_88 == (RhsScalar *)0x0) {
        pdVar9[-1] = 5.43222707274221e-318;
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = operator_delete;
        pdVar9[-1] = (double)&LAB_0010c70b;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      bVar21 = true;
      local_a8 = local_88;
    }
  }
  else {
    bVar21 = 0x20000 < __size;
    local_88 = (RhsScalar *)0x0;
  }
  if (manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize == 0) {
    local_104 = -1;
    pdVar9[-1] = 5.42289417269227e-318;
    queryCacheSizes(&local_104,(int *)&local_80,(int *)&local_7c);
    iVar7 = 0x2000;
    if (0 < local_104) {
      iVar7 = local_104;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l1CacheSize = (long)iVar7;
    local_80 = 0xffffffff;
    local_7c = 0xffffffff;
    pdVar9[-1] = 5.42314614617165e-318;
    queryCacheSizes(&local_104,(int *)&local_80,(int *)&local_7c);
    uVar2 = local_7c;
    if ((int)local_7c < (int)local_80) {
      uVar2 = local_80;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = 0x100000;
    if (0 < (int)uVar2) {
      manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = (ulong)uVar2;
    }
  }
  if (otherSize < 1) {
    local_c8 = 0;
  }
  else {
    lVar14 = size;
    if (size < otherStride) {
      lVar14 = otherStride;
    }
    uVar5 = manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize / (ulong)(lVar14 << 5);
    local_c8 = uVar5 + 3;
    if (-1 < (long)uVar5) {
      local_c8 = uVar5;
    }
    local_c8 = local_c8 & 0xfffffffffffffffc;
  }
  if ((long)local_c8 < 5) {
    local_c8 = 4;
  }
  if (0 < size) {
    local_110 = _other + size;
    startTarget = local_70 * -8;
    local_168 = otherStride * local_c8 * 8;
    local_128 = local_f8 + (size + -1) * uVar8 + size;
    local_150 = (uVar8 * 8 ^ 0xfffffffffffffff8) * local_70;
    local_188 = ~uVar8 << 5;
    local_1a8 = (double)(uVar8 * -8);
    local_170 = local_d0 * 8;
    local_120 = size - local_70;
    local_118 = local_f8 + uVar8 * (size - local_70);
    local_148 = local_70 * uVar8 * -8;
    local_d8 = (RhsScalar)otherSize;
    do {
      uStack_40 = size;
      _l2 = size;
      if ((long)local_70 < size) {
        _l2 = local_70;
      }
      if (0 < (long)local_d8) {
        local_160 = size - _l2;
        local_178 = local_f8 + (size - _l2);
        local_e0 = local_110;
        lVar14 = 0;
        uVar5 = _l2;
        do {
          lStack_100 = lVar14;
          local_b0 = (long)local_d8 - lVar14;
          uVar20 = local_b0;
          if ((long)local_c8 < (long)local_b0) {
            uVar20 = local_c8;
          }
          local_e8 = uVar20;
          uVar13 = uVar5;
          if (0 < (long)uVar5) {
            local_138 = local_a0 + lVar14 * uVar5;
            local_190 = _other + lVar14 * otherStride;
            local_180 = _other + lVar14 * otherStride + local_160;
            local_f0 = local_128;
            local_130 = local_e0;
            pdVar16 = (double *)0x0;
            do {
              cols = local_e8;
              pRVar3 = local_138;
              local_1a0 = uVar5;
              uVar12 = 4;
              if ((long)uVar5 < 4) {
                uVar12 = uVar5;
              }
              uVar5 = 1;
              if (1 < (long)uVar12) {
                uVar5 = uVar12;
              }
              local_68 = pdVar16;
              local_140 = (double *)(uVar13 - (long)pdVar16);
              pdVar10 = (double *)0x4;
              if ((long)local_140 < 4) {
                pdVar10 = local_140;
              }
              local_60 = pdVar10;
              if (0 < (long)local_140) {
                pdVar11 = local_f0 + -uVar12;
                uVar13 = 0;
                do {
                  if (0 < (long)local_b0) {
                    lVar15 = ~((long)pdVar16 + uVar13) + uStack_40;
                    dVar1 = local_f8[lVar15 * uVar8 + lVar15];
                    pdVar17 = local_130 + -uVar12;
                    lVar18 = lStack_100;
                    do {
                      dVar22 = _other[lVar18 * otherStride + lVar15] * (1.0 / dVar1);
                      _other[lVar18 * otherStride + lVar15] = dVar22;
                      if (0 < (long)(~uVar13 + (long)pdVar10)) {
                        lVar19 = 0;
                        do {
                          pdVar17[lVar19] = pdVar11[lVar19] * -dVar22 + pdVar17[lVar19];
                          lVar19 = lVar19 + 1;
                        } while (lVar19 < (long)(~uVar13 + (long)pdVar10));
                      }
                      lVar18 = lVar18 + 1;
                      pdVar17 = pdVar17 + otherStride;
                    } while (lVar18 < (long)(uVar20 + lVar14));
                  }
                  uVar13 = uVar13 + 1;
                  pdVar11 = (double *)((long)pdVar11 + (long)local_1a8);
                } while (uVar13 != uVar5);
              }
              local_198 = uStack_40 - ((long)pdVar16 + (long)pdVar10);
              pdVar16 = local_190 + local_198;
              pdVar9[-1] = (double)((long)local_140 - (long)pdVar10);
              pdVar9[-2] = (double)_l2;
              pdVar9[-3] = 5.42775577864735e-318;
              gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                        (&local_41,pRVar3,pdVar16,otherStride,(long)pdVar10,cols,(long)pdVar9[-2],
                         (long)pdVar9[-1]);
              uVar8 = local_58;
              lVar18 = (long)local_140 - (long)pdVar10;
              if (lVar18 != 0 && (long)pdVar10 <= (long)local_140) {
                pdVar16 = local_178 + local_198 * local_58;
                pdVar9[-2] = 0.0;
                pdVar9[-1] = 0.0;
                pLVar4 = local_50;
                pdVar9[-3] = 5.42814114985111e-318;
                gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                          (local_31,pLVar4,pdVar16,uVar8,(long)pdVar10,lVar18,(long)pdVar9[-2],
                           (long)pdVar9[-1]);
                pLVar4 = local_50;
                pdVar10 = local_60;
                pRVar3 = local_138;
                pdVar16 = local_180;
                pdVar9[-2] = (double)local_a8;
                pdVar9[-3] = (double)lVar18;
                pdVar9[-4] = 0.0;
                pdVar9[-5] = (double)_l2;
                pdVar9[-6] = (double)pdVar10;
                pdVar9[-7] = (double)local_e8;
                pdVar9[-8] = (double)pdVar10;
                pdVar9[-9] = 5.42850181777257e-318;
                gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                          (&local_32,pdVar16,otherStride,pLVar4,pRVar3,lVar18,(long)pdVar9[-8],
                           (long)pdVar9[-7],-1.0,(long)pdVar9[-6],(long)pdVar9[-5],(long)pdVar9[-4],
                           (long)pdVar9[-3],(double *)pdVar9[-2]);
              }
              pdVar16 = (double *)((long)local_68 + 4);
              uVar5 = local_1a0 - 4;
              local_130 = local_130 + -4;
              local_f0 = (double *)((long)local_f0 + local_188);
              uVar13 = _l2;
              uVar8 = local_58;
            } while ((long)pdVar16 < (long)_l2);
          }
          lVar14 = lStack_100 + local_c8;
          local_e0 = (double *)((long)local_e0 + local_168);
          uVar5 = uVar13;
        } while (lVar14 < (long)local_d8);
      }
      if (uStack_40 - local_70 == 0 || (long)uStack_40 < (long)local_70) break;
      uStack_40 = uStack_40 - local_70;
      local_68 = local_118;
      local_b0 = local_120;
      local_60 = _other;
      lVar14 = 0;
      do {
        uVar8 = local_b0;
        local_b0 = local_b0 - local_d0;
        if ((long)local_d0 <= (long)uVar8) {
          uVar8 = local_d0;
        }
        if (0 < (long)uVar8) {
          pdVar9[-2] = 0.0;
          pdVar9[-1] = 0.0;
          pLVar4 = local_50;
          uVar20 = local_58;
          pdVar16 = local_68;
          uVar5 = _l2;
          pdVar9[-3] = 5.42975674451301e-318;
          gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                    (local_31,pLVar4,pdVar16,uVar20,uVar5,uVar8,(long)pdVar9[-2],(long)pdVar9[-1]);
          uVar5 = _l2;
          pdVar9[-2] = (double)local_a8;
          pdVar9[-4] = 0.0;
          pdVar9[-3] = 0.0;
          pdVar9[-5] = -NAN;
          pdVar9[-6] = -NAN;
          pdVar9[-7] = local_d8;
          pdVar9[-8] = (double)uVar5;
          pLVar4 = local_50;
          pdVar16 = local_60;
          pRVar3 = local_a0;
          pdVar9[-9] = 5.43027551344114e-318;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    (&local_32,pdVar16,otherStride,pLVar4,pRVar3,uVar8,(long)pdVar9[-8],
                     (long)pdVar9[-7],-1.0,(long)pdVar9[-6],(long)pdVar9[-5],(long)pdVar9[-4],
                     (long)pdVar9[-3],(double *)pdVar9[-2]);
        }
        lVar14 = lVar14 + local_d0;
        local_60 = (double *)((long)local_60 + local_170);
        local_68 = (double *)((long)local_68 + local_170);
      } while (lVar14 < (long)uStack_40);
      local_110 = (double *)((long)local_110 + startTarget);
      local_128 = (double *)((long)local_128 + local_150);
      local_120 = local_120 - local_70;
      local_118 = (double *)((long)local_118 + local_148);
      size = uStack_40;
      uVar8 = local_58;
    } while (0 < (long)uStack_40);
  }
  pRVar3 = local_88;
  if (bVar21) {
    pdVar9[-1] = 5.43092273943719e-318;
    free(pRVar3);
  }
  pRVar3 = local_90;
  if (0x4000 < local_b8) {
    pdVar9[-1] = 5.43104625584865e-318;
    free(pRVar3);
  }
  pLVar4 = local_98;
  if (0x4000 < local_c0) {
    pdVar9[-1] = 5.43116977226011e-318;
    free(pLVar4);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) *  std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }